

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileContext.cpp
# Opt level: O1

void __thiscall enact::CompileContext::reportErrorAt(CompileContext *this,Token *token,string *msg)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  size_type *psVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[line ",6);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] Error",7);
  if (token->type == ERROR) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":\n",2);
  }
  else {
    if (token->type == END_OF_FILE) {
      pcVar6 = " at end: ";
      lVar5 = 9;
      goto LAB_00107a23;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    iVar1 = std::__cxx11::string::compare((char *)&token->lexeme);
    if (iVar1 == 0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"newline","");
    }
    else {
      std::operator+(&local_50,"\'",&token->lexeme);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_70.field_2._M_allocated_capacity = *psVar4;
        local_70.field_2._8_8_ = plVar3[3];
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar4;
        local_70._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_70._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((iVar1 != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2)) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    ",4);
  iVar1 = std::__cxx11::string::compare((char *)&token->lexeme);
  getSourceLine_abi_cxx11_(&local_70,this,token->line - (uint)(iVar1 == 0));
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    ",5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((token->lexeme)._M_string_length != (ulong)token->col) {
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)token->col - (token->lexeme)._M_string_length);
  }
  if ((token->lexeme)._M_string_length != 0) {
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"^",1);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (token->lexeme)._M_string_length);
  }
  pcVar6 = "\n";
  lVar5 = 1;
LAB_00107a23:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\n",2);
  return;
}

Assistant:

void CompileContext::reportErrorAt(const Token &token, const std::string &msg) {
        std::cerr << "[line " << token.line << "] Error";

        if (token.type == TokenType::END_OF_FILE) {
            std::cerr << " at end: " << msg << "\n\n";
        } else {
            if (token.type == TokenType::ERROR) {
                std::cerr << ":\n";
            } else {
                std::cerr << " at " << (token.lexeme == "\n" ? "newline" : "'" + token.lexeme + "'") << ":\n";
            }

            std::cerr << "    " << getSourceLine(token.lexeme == "\n" ? token.line - 1 : token.line) << "\n    ";
            for (int i = 1; i <= token.col - token.lexeme.size(); ++i) {
                std::cerr << " ";
            }

            for (int i = 1; i <= token.lexeme.size(); ++i) {
                std::cerr << "^";
            }
            std::cerr << "\n" << msg << "\n\n";
        }
    }